

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

char * uv__cgroup1_find_memory_controller(char *buf,int *n)

{
  int iVar1;
  char *__s1;
  size_t sVar2;
  
  do {
    __s1 = strchr(buf,0x3a);
    do {
      if (__s1 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar1 = strncmp(__s1,":memory:",8);
      if (iVar1 == 0) {
        sVar2 = strcspn(__s1 + 9,"\n");
        *n = (int)sVar2;
        return __s1 + 9;
      }
      buf = strchr(__s1,10);
      __s1 = (char *)0x0;
    } while (buf == (char *)0x0);
  } while( true );
}

Assistant:

static char* uv__cgroup1_find_memory_controller(char buf[static 1024],
                                                int* n) {
  char* p;

  /* Seek to the memory controller line. */
  p = strchr(buf, ':');
  while (p != NULL && strncmp(p, ":memory:", 8)) {
    p = strchr(p, '\n');
    if (p != NULL)
      p = strchr(p, ':');
  }

  if (p != NULL) {
    /* Determine the length of the mount path. */
    p = p + strlen(":memory:/");
    *n = (int) strcspn(p, "\n");
  }

  return p;
}